

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_channel_free(ssh2_channel *c)

{
  outstanding_channel_request *ptr;
  ssh2_connection_state *psVar1;
  ssh2_connection_state *s;
  outstanding_channel_request *chanreq;
  ssh2_channel *c_local;
  
  bufchain_clear(&c->outbuffer);
  bufchain_clear(&c->errbuffer);
  while (c->chanreq_head != (outstanding_channel_request *)0x0) {
    ptr = c->chanreq_head;
    c->chanreq_head = c->chanreq_head->next;
    safefree(ptr);
  }
  if (c->chan != (Channel *)0x0) {
    psVar1 = c->connlayer;
    if (psVar1->mainchan_sc == &c->sc) {
      psVar1->mainchan = (mainchan *)0x0;
      psVar1->mainchan_sc = (SshChannel *)0x0;
    }
    chan_free(c->chan);
  }
  safefree(c);
  return;
}

Assistant:

static void ssh2_channel_free(struct ssh2_channel *c)
{
    bufchain_clear(&c->outbuffer);
    bufchain_clear(&c->errbuffer);
    while (c->chanreq_head) {
        struct outstanding_channel_request *chanreq = c->chanreq_head;
        c->chanreq_head = c->chanreq_head->next;
        sfree(chanreq);
    }
    if (c->chan) {
        struct ssh2_connection_state *s = c->connlayer;
        if (s->mainchan_sc == &c->sc) {
            s->mainchan = NULL;
            s->mainchan_sc = NULL;
        }
        chan_free(c->chan);
    }
    sfree(c);
}